

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall
t_py_generator::generate_serialize_container
          (t_py_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  int *piVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  t_py_generator *this_00;
  string *this_01;
  string kiter;
  string viter;
  allocator local_171;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent(&this->super_t_generator,out);
      pcVar4 = "oprot.writeSetBegin(";
      poVar3 = std::operator<<(poVar3,"oprot.writeSetBegin(");
      type_to_enum_abi_cxx11_
                (&local_170,(t_py_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::operator<<(poVar3,(string *)&local_170);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"len(");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,"))");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_0028f2ce;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent(&this->super_t_generator,out);
      pcVar4 = "oprot.writeListBegin(";
      poVar3 = std::operator<<(poVar3,"oprot.writeListBegin(");
      type_to_enum_abi_cxx11_
                (&local_170,(t_py_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::operator<<(poVar3,(string *)&local_170);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,"len(");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,"))");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      goto LAB_0028f2ce;
    }
  }
  else {
    poVar3 = t_generator::indent(&this->super_t_generator,out);
    pcVar4 = "oprot.writeMapBegin(";
    poVar3 = std::operator<<(poVar3,"oprot.writeMapBegin(");
    type_to_enum_abi_cxx11_
              (&local_170,(t_py_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar3 = std::operator<<(poVar3,(string *)&local_170);
    this_00 = (t_py_generator *)0x2fdaef;
    poVar3 = std::operator<<(poVar3,", ");
    type_to_enum_abi_cxx11_(&local_150,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar3 = std::operator<<(poVar3,(string *)&local_150);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,"len(");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,"))");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_150);
LAB_0028f2ce:
    std::__cxx11::string::~string((string *)&local_170);
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_0028f623;
      std::__cxx11::string::string((string *)&local_110,"iter",(allocator *)&local_150);
      t_generator::tmp(&local_170,&this->super_t_generator,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      poVar3 = t_generator::indent(&this->super_t_generator,out);
      poVar3 = std::operator<<(poVar3,"for ");
      poVar3 = std::operator<<(poVar3,(string *)&local_170);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,":");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string((string *)&local_130,(string *)&local_170);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_130);
      this_01 = &local_130;
    }
    else {
      std::__cxx11::string::string((string *)&local_d0,"iter",(allocator *)&local_150);
      t_generator::tmp(&local_170,&this->super_t_generator,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      poVar3 = t_generator::indent(&this->super_t_generator,out);
      poVar3 = std::operator<<(poVar3,"for ");
      poVar3 = std::operator<<(poVar3,(string *)&local_170);
      poVar3 = std::operator<<(poVar3," in ");
      poVar3 = std::operator<<(poVar3,(string *)prefix);
      poVar3 = std::operator<<(poVar3,":");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string((string *)&local_f0,(string *)&local_170);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_f0);
      this_01 = &local_f0;
    }
    std::__cxx11::string::~string((string *)this_01);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"kiter",(allocator *)&local_150);
    t_generator::tmp(&local_170,&this->super_t_generator,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_70,"viter",&local_171);
    t_generator::tmp(&local_150,&this->super_t_generator,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    poVar3 = t_generator::indent(&this->super_t_generator,out);
    poVar3 = std::operator<<(poVar3,"for ");
    poVar3 = std::operator<<(poVar3,(string *)&local_170);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)&local_150);
    poVar3 = std::operator<<(poVar3," in ");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,".items():");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + 1;
    std::__cxx11::string::string((string *)&local_90,(string *)&local_170);
    std::__cxx11::string::string((string *)&local_b0,(string *)&local_150);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    piVar1 = &(this->super_t_generator).indent_;
    *piVar1 = *piVar1 + -1;
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::__cxx11::string::~string((string *)&local_170);
LAB_0028f623:
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') {
        return;
      }
      pcVar4 = "oprot.writeListEnd()";
    }
    else {
      pcVar4 = "oprot.writeSetEnd()";
    }
  }
  else {
    pcVar4 = "oprot.writeMapEnd()";
  }
  poVar3 = t_generator::indent(&this->super_t_generator,out);
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_py_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  if (ttype->is_map()) {
    indent(out) << "oprot.writeMapBegin(" << type_to_enum(((t_map*)ttype)->get_key_type()) << ", "
                << type_to_enum(((t_map*)ttype)->get_val_type()) << ", "
                << "len(" << prefix << "))" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetBegin(" << type_to_enum(((t_set*)ttype)->get_elem_type()) << ", "
                << "len(" << prefix << "))" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListBegin(" << type_to_enum(((t_list*)ttype)->get_elem_type())
                << ", "
                << "len(" << prefix << "))" << endl;
  }

  if (ttype->is_map()) {
    string kiter = tmp("kiter");
    string viter = tmp("viter");
    indent(out) << "for " << kiter << ", " << viter << " in " << prefix << ".items():" << endl;
    indent_up();
    generate_serialize_map_element(out, (t_map*)ttype, kiter, viter);
    indent_down();
  } else if (ttype->is_set()) {
    string iter = tmp("iter");
    indent(out) << "for " << iter << " in " << prefix << ":" << endl;
    indent_up();
    generate_serialize_set_element(out, (t_set*)ttype, iter);
    indent_down();
  } else if (ttype->is_list()) {
    string iter = tmp("iter");
    indent(out) << "for " << iter << " in " << prefix << ":" << endl;
    indent_up();
    generate_serialize_list_element(out, (t_list*)ttype, iter);
    indent_down();
  }

  if (ttype->is_map()) {
    indent(out) << "oprot.writeMapEnd()" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetEnd()" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListEnd()" << endl;
  }
}